

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int Curl_hash_delete(curl_hash *h,void *key,size_t key_len)

{
  curl_llist **ppcVar1;
  curl_llist *list;
  size_t sVar2;
  curl_llist_element *e;
  
  ppcVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
  list = ppcVar1[sVar2];
  e = list->head;
  while( true ) {
    if (e == (curl_llist_element *)0x0) {
      return 1;
    }
    sVar2 = (*h->comp_func)(*(void **)((long)e->ptr + 8),*(size_t *)((long)e->ptr + 0x10),key,
                            key_len);
    if (sVar2 != 0) break;
    e = e->next;
  }
  Curl_llist_remove(list,e,h);
  h->size = h->size - 1;
  return 0;
}

Assistant:

int Curl_hash_delete(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_hash_element  *he;
  struct curl_llist *l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *) h);
      --h->size;
      return 0;
    }
  }
  return 1;
}